

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

bool __thiscall QMdi::ControlLabel::event(ControlLabel *this,QEvent *event)

{
  short sVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QStyleOptionTitleBar options;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  QArrayData *pQStack_50;
  char16_t *local_48;
  undefined1 *puStack_40;
  QIcon local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 0x6e) {
    local_38.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)local_98);
    QStyleOption::initFrom((QStyleOption *)local_98,&this->super_QWidget);
    showToolTip((QHelpEvent *)event,&this->super_QWidget,(QStyleOptionComplex *)local_98,CC_TitleBar
                ,SC_ComboBoxFrame);
    QIcon::~QIcon(&local_38);
    if (pQStack_50 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_50,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
  }
  else if (sVar1 == 100) {
    updateWindowIcon(this);
    local_98._0_8_ = QPixmap::size();
    QWidget::setFixedSize(&this->super_QWidget,(QSize *)local_98);
  }
  else if (sVar1 == 0x22) {
    updateWindowIcon(this);
  }
  bVar2 = QWidget::event(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ControlLabel::event(QEvent *event)
{
    if (event->type() == QEvent::WindowIconChange)
        updateWindowIcon();
    else if (event->type() == QEvent::StyleChange) {
        updateWindowIcon();
        setFixedSize(label.size());
    }
#if QT_CONFIG(tooltip)
    else if (event->type() == QEvent::ToolTip) {
        QStyleOptionTitleBar options;
        options.initFrom(this);
        showToolTip(static_cast<QHelpEvent *>(event), this, options,
                    QStyle::CC_TitleBar, QStyle::SC_TitleBarSysMenu);
    }
#endif
    return QWidget::event(event);
}